

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void FromWabtValueTypes(ValueTypes *types,wasm_valtype_vec_t *out)

{
  pointer pTVar1;
  wasm_valkind_t kind;
  wasm_valtype_t *pwVar2;
  size_t i;
  ulong uVar3;
  
  wasm_valtype_vec_new_uninitialized
            (out,(long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 3);
  for (uVar3 = 0;
      pTVar1 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3);
      uVar3 = uVar3 + 1) {
    kind = FromWabtValueType(pTVar1[uVar3]);
    pwVar2 = wasm_valtype_new(kind);
    out->data[uVar3] = pwVar2;
  }
  return;
}

Assistant:

static void FromWabtValueTypes(const ValueTypes& types,
                               wasm_valtype_vec_t* out) {
  wasm_valtype_vec_new_uninitialized(out, types.size());
  for (size_t i = 0; i < types.size(); ++i) {
    out->data[i] = wasm_valtype_new(FromWabtValueType(types[i]));
  }
}